

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall asmjit::ZoneHashBase::_rehash(ZoneHashBase *this,uint32_t newCount)

{
  size_t *psVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  uint in_ESI;
  size_t *in_RDI;
  uint32_t hMod;
  ZoneHashNode *next;
  ZoneHashNode *node;
  uint32_t oldCount;
  uint32_t i;
  ZoneHashNode **newData;
  ZoneHashNode **oldData;
  uint32_t slot;
  size_t allocatedSize;
  char *in_stack_00000330;
  int in_stack_0000033c;
  char *in_stack_00000340;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  ZoneHeap *in_stack_ffffffffffffff60;
  ZoneHeap *local_98;
  uint local_8c;
  uint local_64;
  ulong local_60;
  size_t *local_58;
  long *local_50;
  long *local_48;
  long local_30;
  long *local_28;
  long *local_20;
  uint *local_18;
  ulong local_10;
  char local_1;
  
  if (*in_RDI == 0) {
    DebugUtils::assertionFailed(in_stack_00000340,in_stack_0000033c,in_stack_00000330);
  }
  psVar1 = (size_t *)in_RDI[3];
  local_28 = (long *)*in_RDI;
  local_30 = (ulong)in_ESI << 3;
  local_20 = local_28;
  if (*local_28 == 0) {
    DebugUtils::assertionFailed(in_stack_00000340,in_stack_0000033c,in_stack_00000330);
  }
  pvVar3 = ZoneHeap::_allocZeroed
                     (in_stack_ffffffffffffff60,
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),in_RDI);
  if (pvVar3 != (void *)0x0) {
    sVar2 = in_RDI[2];
    for (local_8c = 0; local_8c < (uint)sVar2; local_8c = local_8c + 1) {
      local_98 = (ZoneHeap *)psVar1[local_8c];
      while (local_98 != (ZoneHeap *)0x0) {
        in_stack_ffffffffffffff60 = (ZoneHeap *)local_98->_zone;
        in_stack_ffffffffffffff5c = *(uint *)local_98->_slots % in_ESI;
        local_98->_zone = *(Zone **)((long)pvVar3 + (ulong)in_stack_ffffffffffffff5c * 8);
        *(ZoneHeap **)((long)pvVar3 + (ulong)in_stack_ffffffffffffff5c * 8) = local_98;
        local_98 = in_stack_ffffffffffffff60;
      }
    }
    if (psVar1 != in_RDI + 4) {
      local_50 = (long *)*in_RDI;
      uVar4 = (ulong)(uint)in_RDI[2];
      local_60 = uVar4 * 8;
      local_58 = psVar1;
      local_48 = local_50;
      if (*local_50 == 0) {
        DebugUtils::assertionFailed(in_stack_00000340,in_stack_0000033c,in_stack_00000330);
      }
      if (psVar1 == (size_t *)0x0) {
        DebugUtils::assertionFailed(in_stack_00000340,in_stack_0000033c,in_stack_00000330);
      }
      if (uVar4 == 0) {
        DebugUtils::assertionFailed(in_stack_00000340,in_stack_0000033c,in_stack_00000330);
      }
      local_18 = &local_64;
      local_10 = local_60;
      if (uVar4 == 0) {
        DebugUtils::assertionFailed(in_stack_00000340,in_stack_0000033c,in_stack_00000330);
      }
      if (local_60 < 0x201) {
        if (local_60 < 0x81) {
          local_64 = (uint)(local_60 - 1 >> 5);
        }
        else {
          local_64 = (int)(local_60 - 0x81 >> 6) + 4;
        }
        local_1 = '\x01';
      }
      else {
        local_1 = '\0';
      }
      if (local_1 == '\0') {
        ZoneHeap::_releaseDynamic
                  (in_stack_ffffffffffffff60,
                   (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (size_t)in_RDI);
      }
      else {
        *psVar1 = local_50[(ulong)local_64 + 1];
        local_50[(ulong)local_64 + 1] = (long)psVar1;
      }
    }
    *(uint *)(in_RDI + 2) = in_ESI;
    *(uint *)((long)in_RDI + 0x14) = (in_ESI * 9) / 10;
    in_RDI[3] = (size_t)pvVar3;
  }
  return;
}

Assistant:

void ZoneHashBase::_rehash(uint32_t newCount) noexcept {
  ASMJIT_ASSERT(isInitialized());

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    _heap->allocZeroed(static_cast<size_t>(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hMod = node->_hVal % newCount;

      node->_hashNext = newData[hMod];
      newData[hMod] = node;

      node = next;
    }
  }

  // 90% is the maximum occupancy, can't overflow since the maximum capacity
  // is limited to the last prime number stored in the prime table.
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _bucketsCount = newCount;
  _bucketsGrow = newCount * 9 / 10;

  _data = newData;
}